

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slab_arena.c
# Opt level: O3

int slab_arena_create(slab_arena *arena,quota *quota,size_t prealloc,uint32_t slab_size,int flags)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  void *ptr;
  size_t size;
  ulong uVar4;
  int iVar5;
  unsigned_long _zzq_args [6];
  unsigned_long _zzq_result;
  
  (arena->cache).next = (void *)0x0;
  uVar2 = (ulong)((long)arena << 3) >> 0x33;
  uVar4 = (((long)arena << 3 | (ulong)arena >> 0x3d) << 0xd | uVar2) >> 3;
  uVar4 = uVar4 << 0x33 | (uVar2 << 0x3d | uVar4) >> 0xd;
  uVar2 = 0x10000;
  if (0x10000 < slab_size) {
    uVar2 = (ulong)slab_size;
  }
  lVar1 = 0x3f;
  if (uVar2 - 1 != 0) {
    for (; uVar2 - 1 >> lVar1 == 0; lVar1 = lVar1 + -1) {
    }
  }
  uVar3 = 1L << (-((byte)lVar1 ^ 0x3f) & 0x3f);
  *(int *)(uVar4 + 0x28) = (int)uVar3;
  *(quota **)(uVar4 + 0x20) = quota;
  uVar2 = (ulong)*(uint *)((long)&quota->value + 4) << 10;
  if (prealloc <= uVar2) {
    uVar2 = prealloc;
  }
  uVar3 = uVar3 & 0xffffffff;
  uVar2 = -uVar3 & (uVar3 + uVar2) - 1;
  arena->prealloc = uVar2;
  arena->used = 0;
  if (flags < 0) {
    if ((~flags & 0x80000002U) != 0 && (~flags & 0x80000001U) != 0) {
      __assert_fail("IS_SLAB_ARENA_FLAG(flags, SLAB_ARENA_PRIVATE) || IS_SLAB_ARENA_FLAG(flags, SLAB_ARENA_SHARED)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/slab_arena.c"
                    ,0xad,"void slab_arena_flags_init(struct slab_arena *, int)");
    }
    arena->flags = flags;
  }
  else {
    if ((flags & 3U) == 0) {
      __assert_fail("flags & (MAP_PRIVATE | MAP_SHARED)",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/slab_arena.c"
                    ,0xa4,"void slab_arena_flags_init(struct slab_arena *, int)");
    }
    if (flags == 2) {
      arena->flags = -0x7fffffff;
      flags = -0x7fffffff;
    }
    else {
      arena->flags = -0x7ffffffe;
      flags = -0x7ffffffe;
    }
  }
  iVar5 = 0;
  if (uVar2 == 0) {
    size = 0;
    ptr = (void *)0x0;
  }
  else {
    ptr = mmap_checked(uVar2,uVar3,flags);
    size = arena->prealloc;
    flags = arena->flags;
  }
  arena->arena = ptr;
  madvise_checked(ptr,size,flags);
  if (arena->prealloc != 0) {
    iVar5 = -(uint)(arena->arena == (void *)0x0);
  }
  return iVar5;
}

Assistant:

int
slab_arena_create(struct slab_arena *arena, struct quota *quota,
		  size_t prealloc, uint32_t slab_size, int flags)
{
	lf_lifo_init(&arena->cache);
	VALGRIND_MAKE_MEM_DEFINED(&arena->cache, sizeof(struct lf_lifo));

	/*
	 * Round up the user supplied data - it can come in
	 * directly from the configuration file. Allow
	 * zero-size arena for testing purposes.
	 */
	arena->slab_size = small_round(MAX(slab_size, SLAB_MIN_SIZE));

	arena->quota = quota;
	/** Prealloc can not be greater than the quota */
	prealloc = MIN(prealloc, quota_total(quota));
	/** Extremely large sizes can not be aligned properly */
	prealloc = MIN(prealloc, SIZE_MAX - arena->slab_size);
	/* Align prealloc around a fixed number of slabs. */
	arena->prealloc = small_align(prealloc, arena->slab_size);

	arena->used = 0;

	slab_arena_flags_init(arena, flags);

	if (arena->prealloc) {
		arena->arena = mmap_checked(arena->prealloc,
					    arena->slab_size,
					    arena->flags);
	} else {
		arena->arena = NULL;
	}

	madvise_checked(arena->arena, arena->prealloc, arena->flags);

	return arena->prealloc && !arena->arena ? -1 : 0;
}